

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.c
# Opt level: O2

_Bool cfg_loadf(char *path,config_item *items)

{
  _Bool _Var1;
  int iVar2;
  FILE *__stream;
  size_t sVar3;
  char *pcVar4;
  stat filestatus;
  
  if (path == (char *)0x0) {
    pcVar4 = "Empty path specified!";
    iVar2 = 0x4e;
  }
  else {
    iVar2 = stat(path,(stat *)&filestatus);
    if (iVar2 == 0) {
      pcVar4 = (char *)malloc(filestatus.st_size);
      if (pcVar4 != (char *)0x0) {
        __stream = fopen(path,"rt");
        if (__stream == (FILE *)0x0) {
          _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cfg.c",
                     0x5e,"load_config_file",0,3,"Unable to open file: %s\n",path);
          __stream = (FILE *)0x0;
        }
        else {
          sVar3 = fread(pcVar4,filestatus.st_size,1,__stream);
          if (sVar3 == 1) {
            fclose(__stream);
            _Var1 = cfg_loads(pcVar4,filestatus.st_size,items);
            free(pcVar4);
            return _Var1;
          }
          _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cfg.c",
                     100,"load_config_file",0,3,"Unable t read content of %s\n",path);
        }
        fclose(__stream);
        free(pcVar4);
        return false;
      }
      pcVar4 = "Out of memory!";
      iVar2 = 0x58;
    }
    else {
      pcVar4 = "File not found: %s";
      iVar2 = 0x52;
    }
  }
  _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cfg.c",iVar2,
             "load_config_file",0,3,pcVar4);
  return false;
}

Assistant:

static void * load_config_file(const char * path, size_t *len)
{
    FILE *fp;
    struct stat filestatus;
    size_t file_size;
    char* buff;

    if (path == NULL) {
        log_error(LOG_ERR, "Empty path specified!");
        return NULL;
    }
    if (stat(path, &filestatus) != 0) {
        log_error(LOG_ERR, "File not found: %s", path);
        return NULL;
    }
    file_size = filestatus.st_size;
    buff = (char*)malloc(filestatus.st_size);
    if (buff == NULL) {
        log_error(LOG_ERR, "Out of memory!");
        return NULL;
    }

    fp = fopen(path, "rt");
    if (fp == NULL) {
        log_error(LOG_ERR, "Unable to open file: %s\n", path);
        fclose(fp);
        free(buff);
        return NULL;
    }
    if (fread(buff, file_size, 1, fp) != 1 ) {
        log_error(LOG_ERR, "Unable t read content of %s\n", path);
        fclose(fp);
        free(buff);
        return NULL;
    }
    fclose(fp);
    *len = file_size;
    return buff;
}